

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * exprTableRegister(Parse *pParse,Table *pTab,int regBase,i16 iCol)

{
  char *pcVar1;
  sqlite3 *db;
  Column *pCVar2;
  i16 iVar3;
  Expr *pExpr;
  char *pcVar4;
  char *pcVar5;
  Token local_40;
  
  db = pParse->db;
  local_40.z = (char *)0x0;
  local_40.n = 0;
  pExpr = sqlite3ExprAlloc(db,0xb0,&local_40,0);
  if (pExpr == (Expr *)0x0) {
    pExpr = (Expr *)0x0;
  }
  else if ((iCol < 0) || (pTab->iPKey == iCol)) {
    pExpr->iTable = regBase;
    pExpr->affExpr = 'D';
  }
  else {
    pCVar2 = pTab->aCol;
    iVar3 = sqlite3TableColumnToStorage(pTab,iCol);
    pExpr->iTable = iVar3 + regBase + 1;
    pExpr->affExpr = pCVar2[(ushort)iCol].affinity;
    if ((pCVar2[(ushort)iCol].colFlags >> 9 & 1) == 0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = pCVar2[(ushort)iCol].zCnName + -1;
      do {
        pcVar5 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      } while (*pcVar5 != '\0');
      pcVar5 = pcVar4;
      if ((pCVar2[(ushort)iCol].colFlags & 4) != 0) {
        do {
          pcVar4 = pcVar5 + 1;
          pcVar1 = pcVar5 + 1;
          pcVar5 = pcVar4;
        } while (*pcVar1 != '\0');
      }
      pcVar4 = pcVar4 + 1;
    }
    if (pcVar4 == (char *)0x0) {
      pcVar4 = db->pDfltColl->zName;
    }
    pExpr = sqlite3ExprAddCollateString(pParse,pExpr,pcVar4);
  }
  return pExpr;
}

Assistant:

static Expr *exprTableRegister(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* The table whose content is at r[regBase]... */
  int regBase,       /* Contents of table pTab */
  i16 iCol           /* Which column of pTab is desired */
){
  Expr *pExpr;
  Column *pCol;
  const char *zColl;
  sqlite3 *db = pParse->db;

  pExpr = sqlite3Expr(db, TK_REGISTER, 0);
  if( pExpr ){
    if( iCol>=0 && iCol!=pTab->iPKey ){
      pCol = &pTab->aCol[iCol];
      pExpr->iTable = regBase + sqlite3TableColumnToStorage(pTab,iCol) + 1;
      pExpr->affExpr = pCol->affinity;
      zColl = sqlite3ColumnColl(pCol);
      if( zColl==0 ) zColl = db->pDfltColl->zName;
      pExpr = sqlite3ExprAddCollateString(pParse, pExpr, zColl);
    }else{
      pExpr->iTable = regBase;
      pExpr->affExpr = SQLITE_AFF_INTEGER;
    }
  }
  return pExpr;
}